

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O1

string * __thiscall
flow::disassemble_abi_cxx11_
          (string *__return_storage_ptr__,flow *this,Instruction pc,size_t ip,size_t sp,
          ConstantPool *cp)

{
  int iVar1;
  ulong *puVar2;
  bool bVar3;
  string *psVar4;
  ushort uVar5;
  uint uVar6;
  size_t sVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 uVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  long *plVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  Operand A;
  string word;
  Operand B;
  Operand C;
  string __str;
  stringstream line;
  undefined6 in_stack_fffffffffffffb68;
  long *local_490;
  ulong local_488;
  long local_480 [2];
  ushort local_46c;
  ushort local_46a;
  long *local_468;
  ulong uStack_460;
  long local_458 [2];
  long *local_448;
  long *local_440;
  ulong *local_438 [2];
  ulong local_428 [2];
  ulong local_418;
  ulong local_408;
  string local_3f8;
  undefined1 local_3d8 [504];
  long *local_1e0;
  string *local_1d8;
  flow *local_1d0;
  Instruction local_1c8;
  size_t local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  args;
  
  uVar5 = (ushort)((ulong)this >> 0x10);
  local_46c = (ushort)((ulong)this >> 0x20);
  local_46a = (ushort)((ulong)this >> 0x30);
  uVar13 = (uint)this & 0xff;
  puVar2 = *(ulong **)(instructionInfos + (ulong)(uVar13 << 5) + 8);
  local_1d8 = __return_storage_ptr__;
  local_1d0 = this;
  local_1c8 = pc;
  local_1c0 = ip;
  std::__cxx11::stringstream::stringstream(local_1b8);
  args.values_ = (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)local_438;
  local_3f8._M_string_length = (size_type)local_3d8;
  local_3f8.field_2._M_allocated_capacity = 0;
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
  local_3f8.field_2._8_8_ = 500;
  args_00.field_1.values_ = args.values_;
  args_00.types_ = 10;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{:<10}";
  local_438[0] = puVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3f8,format_str_02,args_00);
  local_490 = local_480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_490,local_3f8._M_string_length,
             (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
  if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
    operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
  uVar19 = local_488;
  if (sp == 0) {
    iVar1 = *(int *)(instructionInfos + (ulong)(uVar13 << 5) + 0x10);
    if (iVar1 == 1) {
      local_468 = (long *)(ulong)uVar5;
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
      local_3f8._M_string_length = (size_type)local_3d8;
      local_3f8.field_2._8_8_ = 500;
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_468;
      args_03.types_ = 3;
      format_str_05.size_ = 2;
      format_str_05.data_ = "{}";
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_3f8,format_str_05,args_03);
      local_438[0] = local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,local_3f8._M_string_length,
                 (undefined1 *)
                 (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
      if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
        operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
      }
      std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else if (iVar1 == 2) {
      local_438[0] = (ulong *)(ulong)uVar5;
      local_428[0] = (ulong)local_46c;
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
      local_3f8._M_string_length = (size_type)local_3d8;
      local_3f8.field_2._8_8_ = 500;
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_438;
      args_02.types_ = 0x33;
      format_str_04.size_ = 6;
      format_str_04.data_ = "{}, {}";
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_3f8,format_str_04,args_02);
      local_468 = local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_468,local_3f8._M_string_length,
                 (undefined1 *)
                 (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
      if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
        operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
      }
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_468);
      if (local_468 != local_458) {
        operator_delete(local_468,local_458[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else {
      if (iVar1 != 3) goto LAB_00160267;
      local_438[0] = (ulong *)(ulong)uVar5;
      local_428[0] = (ulong)local_46c;
      local_418 = (ulong)local_46a;
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
      local_3f8._M_string_length = (size_type)local_3d8;
      local_3f8.field_2._8_8_ = 500;
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_438;
      args_01.types_ = 0x333;
      format_str_03.size_ = 10;
      format_str_03.data_ = "{}, {}, {}";
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_3f8,format_str_03,args_01);
      local_468 = local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_468,local_3f8._M_string_length,
                 (undefined1 *)
                 (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
      if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
        operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
      }
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_468);
      if (local_468 != local_458) {
        operator_delete(local_468,local_458[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    goto LAB_0016025a;
  }
  if (0x2a < uVar13) {
    if (uVar13 < 0x41) {
      if (uVar13 == 0x2b) {
        puVar2 = (ulong *)(*(long *)(sp + 0x18) + (ulong)uVar5 * 0x20);
        local_468 = (long *)*puVar2;
        uStack_460 = puVar2[1];
        local_3f8.field_2._M_allocated_capacity = 0;
        local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
        local_3f8._M_string_length = (size_type)local_3d8;
        local_3f8.field_2._8_8_ = 500;
        args_06.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_468;
        args_06.types_ = 0xb;
        format_str_08.size_ = 4;
        format_str_08.data_ = "\"{}\"";
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_3f8,format_str_08,args_06);
        local_438[0] = local_428;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,local_3f8._M_string_length,
                   (undefined1 *)
                   (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
        local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
        if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
          operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
        }
        std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
        if (local_438[0] != local_428) {
          operator_delete(local_438[0],local_428[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
      }
      else {
        if (uVar13 != 0x3d) goto switchD_0015f2f3_caseD_11;
        lVar20 = (ulong)uVar5 * 0x40 + (ulong)uVar5 * 4;
        pcVar14 = (char *)(*(long *)(sp + 0x30) + lVar20 + 4);
        if (*pcVar14 == '\0') {
          piVar17 = (int *)(*(long *)(sp + 0x30) + lVar20);
          inet_ntop(*piVar17,(void *)((long)piVar17 + 0x32),pcVar14,0x2e);
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        sVar7 = strlen(pcVar14);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,pcVar14,pcVar14 + sVar7);
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
      }
    }
    else if (uVar13 == 0x41) {
      util::Cidr::str_abi_cxx11_
                (&local_3f8,(Cidr *)((ulong)((uint)uVar5 * 0x50) + *(long *)(sp + 0x48)));
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else if (uVar13 == 0x49) {
      std::__cxx11::string::_M_assign((string *)&local_490);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else {
      if (uVar13 != 0x4a) goto switchD_0015f2f3_caseD_11;
      std::__cxx11::string::_M_assign((string *)&local_490);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    goto LAB_0016025a;
  }
  switch(uVar13) {
  case 0xb:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    lVar18 = uVar19 + 1;
    uVar19 = (ulong)uVar5;
    lVar20 = *(long *)(sp + 0x78);
    lVar11 = *(long *)(lVar20 + 8 + uVar19 * 0x18) - *(long *)(lVar20 + uVar19 * 0x18);
    if (lVar11 != 0) {
      local_1e0 = (long *)(lVar11 >> 3);
      local_448 = (long *)(lVar20 + uVar19 * 0x18);
      plVar16 = (long *)0x0;
      do {
        if (plVar16 != (long *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar18 = lVar18 + 2;
        }
        uVar19 = *(ulong *)(*local_448 + (long)plVar16 * 8);
        uVar21 = -uVar19;
        if (0 < (long)uVar19) {
          uVar21 = uVar19;
        }
        uVar13 = 1;
        if (9 < uVar21) {
          uVar9 = uVar21;
          uVar6 = 4;
          do {
            uVar13 = uVar6;
            if (uVar9 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_0015f3e7;
            }
            if (uVar9 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_0015f3e7;
            }
            if (uVar9 < 10000) goto LAB_0015f3e7;
            bVar3 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            uVar6 = uVar13 + 4;
          } while (bVar3);
          uVar13 = uVar13 + 1;
        }
LAB_0015f3e7:
        local_440 = plVar16;
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_3f8,(char)uVar13 - (char)((long)uVar19 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_3f8._M_dataplus._M_p + -((long)uVar19 >> 0x3f),uVar13,uVar21);
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
        lVar18 = lVar18 + local_488;
        plVar16 = (long *)((long)local_440 + 1);
      } while (plVar16 != local_1e0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    break;
  case 0xc:
    local_3f8._M_dataplus._M_p._0_1_ = 0x5b;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
    lVar18 = uVar19 + 1;
    uVar19 = (ulong)uVar5;
    lVar20 = *(long *)(sp + 0x90);
    lVar11 = *(long *)(lVar20 + 8 + uVar19 * 0x18) - *(long *)(lVar20 + uVar19 * 0x18);
    if (lVar11 != 0) {
      plVar16 = (long *)(lVar20 + uVar19 * 0x18);
      lVar20 = 8;
      lVar15 = 0;
      do {
        if (lVar15 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar18 = lVar18 + 2;
        }
        local_3f8._M_dataplus._M_p._0_1_ = 0x22;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
        lVar22 = *plVar16;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,*(char **)(lVar22 + -8 + lVar20),*(long *)(lVar22 + lVar20));
        local_3f8._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_3f8,1);
        lVar18 = lVar18 + *(long *)(*plVar16 + lVar20) + 2;
        lVar15 = lVar15 + 1;
        lVar20 = lVar20 + 0x20;
      } while (lVar11 >> 5 != lVar15);
    }
    local_3f8._M_dataplus._M_p._0_1_ = 0x5d;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
    break;
  case 0xd:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    lVar18 = uVar19 + 1;
    uVar19 = (ulong)uVar5;
    lVar20 = *(long *)(sp + 0xa8);
    lVar11 = *(long *)(lVar20 + 8 + uVar19 * 0x18) - *(long *)(lVar20 + uVar19 * 0x18);
    if (lVar11 != 0) {
      local_448 = (long *)((lVar11 >> 2) * -0xf0f0f0f0f0f0f0f);
      local_440 = (long *)(lVar20 + uVar19 * 0x18);
      lVar20 = 0;
      plVar16 = (long *)0x0;
      do {
        if (plVar16 != (long *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar18 = lVar18 + 2;
        }
        lVar11 = *local_440;
        pcVar14 = (char *)(lVar11 + lVar20 + 4);
        if (*pcVar14 == '\0') {
          inet_ntop(*(int *)(lVar11 + lVar20),(void *)(lVar11 + lVar20 + 0x32),pcVar14,0x2e);
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        sVar7 = strlen(pcVar14);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,pcVar14,lVar20 + lVar11 + sVar7 + 4);
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
        lVar18 = lVar18 + local_488;
        plVar16 = (long *)((long)plVar16 + 1);
        lVar20 = lVar20 + 0x44;
      } while (local_448 != plVar16);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    break;
  case 0xe:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    lVar18 = uVar19 + 1;
    uVar19 = (ulong)uVar5;
    lVar20 = *(long *)(sp + 0xc0);
    lVar11 = *(long *)(lVar20 + 8 + uVar19 * 0x18) - *(long *)(lVar20 + uVar19 * 0x18);
    if (lVar11 != 0) {
      lVar15 = 0;
      lVar22 = 0;
      do {
        if (lVar22 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar18 = lVar18 + 2;
        }
        util::Cidr::str_abi_cxx11_(&local_3f8,(Cidr *)(*(long *)(lVar20 + uVar19 * 0x18) + lVar15));
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
        lVar18 = lVar18 + local_488;
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + 0x50;
      } while ((lVar11 >> 4) * -0x3333333333333333 - lVar22 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    break;
  case 0xf:
    local_468 = (long *)(ulong)uVar5;
    local_3f8.field_2._M_allocated_capacity = 0;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
    local_3f8._M_string_length = (size_type)local_3d8;
    local_3f8.field_2._8_8_ = 500;
    args_04.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_04.types_ = 3;
    format_str_06.size_ = 9;
    format_str_06.data_ = "STACK[{}]";
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3f8,format_str_06,args_04);
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,local_3f8._M_string_length,
               (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity))
    ;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
    if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
      operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
    }
    std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    goto LAB_0016025a;
  case 0x10:
    local_468 = (long *)(ulong)uVar5;
    local_3f8.field_2._M_allocated_capacity = 0;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
    local_3f8._M_string_length = (size_type)local_3d8;
    local_3f8.field_2._8_8_ = 500;
    args_05.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_468;
    args_05.types_ = 3;
    format_str_07.size_ = 10;
    format_str_07.data_ = "@STACK[{}]";
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3f8,format_str_07,args_05);
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,local_3f8._M_string_length,
               (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity))
    ;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
    if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
      operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
    }
    std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    goto LAB_0016025a;
  default:
switchD_0015f2f3_caseD_11:
    iVar1 = *(int *)(instructionInfos + (ulong)(uVar13 << 5) + 0x10);
    if (iVar1 == 1) {
      format_str_01.size_ = (size_t)&stack0xfffffffffffffb6e;
      format_str_01.data_ = (char *)0x2;
      fmt::v5::format<unsigned_short>
                (&local_3f8,(v5 *)0x16e5e7,format_str_01,(unsigned_short *)args.values_);
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else if (iVar1 == 2) {
      format_str_00.size_ = (size_t)&stack0xfffffffffffffb6e;
      format_str_00.data_ = (char *)0x6;
      fmt::v5::format<unsigned_short,unsigned_short>
                (&local_3f8,(v5 *)0x16e5e3,format_str_00,&local_46c,(unsigned_short *)cp);
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else {
      if (iVar1 != 3) goto LAB_00160267;
      format_str.size_ = (size_t)&stack0xfffffffffffffb6e;
      format_str.data_ = (char *)0xa;
      fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
                (&local_3f8,(v5 *)"{}, {}, {}",format_str,&local_46c,&local_46a,
                 (unsigned_short *)CONCAT26(uVar5,in_stack_fffffffffffffb68));
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    goto LAB_0016025a;
  case 0x12:
    uVar21 = *(ulong *)(*(long *)sp + (ulong)uVar5 * 8);
    uVar9 = -uVar21;
    if (0 < (long)uVar21) {
      uVar9 = uVar21;
    }
    uVar13 = 1;
    if (9 < uVar9) {
      uVar10 = uVar9;
      uVar6 = 4;
      do {
        uVar13 = uVar6;
        if (uVar10 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001601d8;
        }
        if (uVar10 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001601d8;
        }
        if (uVar10 < 10000) goto LAB_001601d8;
        bVar3 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar6 = uVar13 + 4;
      } while (bVar3);
      uVar13 = uVar13 + 1;
    }
LAB_001601d8:
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_3f8,(char)uVar13 - (char)((long)uVar21 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_3f8._M_dataplus._M_p + -((long)uVar21 >> 0x3f),uVar13,uVar9);
    std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
LAB_0016025a:
    uVar19 = uVar19 + local_488;
    goto LAB_00160267;
  }
  uVar19 = lVar18 + 1;
LAB_00160267:
  if (uVar19 < 0x23) {
    lVar20 = uVar19 - 0x23;
    do {
      local_3f8._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
  }
  uVar6 = getStackChange((Instruction)local_1d0);
  uVar13 = -uVar6;
  if (0 < (int)uVar6) {
    uVar13 = uVar6;
  }
  local_408 = (ulong)uVar13;
  uVar12 = 0x2d;
  if (uVar6 == 0) {
    uVar12 = 0x20;
  }
  local_438[0] = (ulong *)local_1c8;
  local_428[0] = local_1c0;
  local_418 = 0x2b;
  if ((int)uVar6 < 1) {
    local_418 = uVar12;
  }
  local_3f8.field_2._M_allocated_capacity = 0;
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
  local_3f8._M_string_length = (size_type)local_3d8;
  local_3f8.field_2._8_8_ = 500;
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_438;
  args_07.types_ = 0x2755;
  format_str_09.size_ = 0x1a;
  format_str_09.data_ = "; ip={:>3} sp={:>2} ({}{})";
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3f8,format_str_09,args_07);
  local_468 = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_468,local_3f8._M_string_length,
             (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_00194440;
  if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
    operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
  }
  std::__cxx11::string::operator=((string *)&local_490,(string *)&local_468);
  if (local_468 != local_458) {
    operator_delete(local_468,local_458[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
  psVar4 = local_1d8;
  std::__cxx11::stringbuf::str();
  if (local_490 != local_480) {
    operator_delete(local_490,local_480[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string disassemble(Instruction pc, size_t ip, size_t sp, const ConstantPool* cp) {
  const Opcode opc = opcode(pc);
  const Operand A = operandA(pc);
  const Operand B = operandB(pc);
  const Operand C = operandC(pc);
  const char* mnemo = mnemonic(opc);
  std::stringstream line;
  size_t n = 0;

  std::string word = fmt::format("{:<10}", mnemo);
  line << word;
  n += word.size();

  // operands
  if (cp != nullptr) {
    switch (opc) {
      case Opcode::ITLOAD: {
        line << "[";
        n++;
        const std::vector<FlowNumber>& v = cp->getIntArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = std::to_string(v[i]);
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::STLOAD: {
        line << '[';
        n++;
        const std::vector<std::string>& v = cp->getStringArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          line << '"' << v[i] << '"';
          n += v[i].size() + 2;
        }
        line << ']';
        n += 1;
        break;
      }
      case Opcode::PTLOAD: {
        line << "[";
        n++;
        const std::vector<util::IPAddress>& v = cp->getIPAddressArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::CTLOAD: {
        line << "[";
        n++;
        const std::vector<util::Cidr>& v = cp->getCidrArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::LOAD:
        word = fmt::format("STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::STORE:
        word = fmt::format("@STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::NLOAD:
        word = std::to_string(cp->getInteger(A));
        line << word;
        n += word.size();
        break;
      case Opcode::SLOAD:
        word = fmt::format("\"{}\"", cp->getString(A));
        line << word;
        n += word.size();
        break;
      case Opcode::PLOAD:
        word = cp->getIPAddress(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CLOAD:
        word = cp->getCidr(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CALL:
        word = cp->getNativeFunctionSignatures()[A];
        line << word;
        n += word.size();
        break;
      case Opcode::HANDLER:
        word = cp->getNativeHandlerSignatures()[A];
        line << word;
        n += word.size();
        break;
      default:
        switch (operandSignature(opc)) {
          case OperandSig::III:
            word = fmt::format("{}, {}, {}", A, B, C);
            line << word;
            n += word.size();
            break;
          case OperandSig::II:
            word = fmt::format("{}, {}", A, B);
            line << word;
            n += word.size();
            break;
          case OperandSig::I:
            word = fmt::format("{}", A);
            line << word;
            n += word.size();
            break;
          case OperandSig::V:
            break;
        }
        break;
    }
  } else {
    switch (operandSignature(opc)) {
      case OperandSig::III:
        word = fmt::format("{}, {}, {}", A, B, C);
        line << word;
        n += word.size();
        break;
      case OperandSig::II:
        word = fmt::format("{}, {}", A, B);
        line << word;
        n += word.size();
        break;
      case OperandSig::I:
        word = fmt::format("{}", A);
        line << word;
        n += word.size();
        break;
      case OperandSig::V:
        break;
    }
  }

  while (n < 35) {
    line << ' ';
    n++;
  }

  int stackChange = getStackChange(pc);

  word = fmt::format("; ip={:>3} sp={:>2} ({}{})",
                     ip, sp,
                     stackChange > 0 ? '+' :
                         stackChange < 0 ? '-' : ' ',
                     std::abs(stackChange));
  line << word;

  return line.str();
}